

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpabortdescriptors.cpp
# Opt level: O0

int __thiscall jrtplib::RTPAbortDescriptors::ReadSignallingByte(RTPAbortDescriptors *this)

{
  undefined1 local_19;
  RTPAbortDescriptors *pRStack_18;
  uchar buf [1];
  RTPAbortDescriptors *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local._4_4_ = -0xae;
  }
  else {
    pRStack_18 = this;
    read(this->m_descriptors[0],&local_19,1);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPAbortDescriptors::ReadSignallingByte()
{
	if (!m_init)
		return ERR_RTP_ABORTDESC_NOTINIT;

	unsigned char buf[1];

	if (read(m_descriptors[0],buf,1))
	{
		// To get rid of __wur related compiler warnings
	}
	return 0;
}